

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

parser_error parse_town(parser *p)

{
  int *piVar1;
  undefined4 uVar2;
  town *ptVar3;
  level_map_conflict *plVar4;
  int iVar5;
  void *pvVar6;
  char *__s1;
  undefined8 *puVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  
  pvVar6 = parser_priv(p);
  __s1 = parser_getstr(p,"name");
  for (plVar4 = maps; plVar4 != (level_map_conflict *)0x0; plVar4 = plVar4->next) {
    if (0 < plVar4->num_towns) {
      lVar9 = 0x20;
      lVar10 = 0;
      do {
        ptVar3 = plVar4->towns;
        iVar5 = strcmp(__s1,*(char **)((long)ptVar3 + lVar9 + -0x18));
        if (iVar5 == 0) {
          uVar2 = *(undefined4 *)((long)pvVar6 + 0x18);
          puVar7 = (undefined8 *)mem_zalloc(0x90);
          *(undefined4 *)(puVar7 + 3) = uVar2;
          *(uint16_t *)((long)puVar7 + 0x32) = z_info->store_inven_max;
          pcVar8 = string_make(*(char **)((long)pvVar6 + 0x20));
          puVar7[4] = pcVar8;
          *puVar7 = *(undefined8 *)((long)ptVar3 + lVar9 + -8);
          *(undefined8 **)((long)ptVar3 + lVar9 + -8) = puVar7;
          piVar1 = (int *)((long)&ptVar3->index + lVar9);
          *piVar1 = *piVar1 + 1;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x28;
      } while (lVar10 < plVar4->num_towns);
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_town(struct parser *p) {
	struct store *s = parser_priv(p);
	const char *name = parser_getstr(p, "name");
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			if (streq(name, town->code)) {
				/* Add a new store ready to fill up with details */
				struct store *new = store_new(s->sidx);
				new->name = string_make(s->name);
				new->next = town->stores;
				town->stores = new;
				town->num_stores++;
			}
		}
		map = map->next;
	}
	return PARSE_ERROR_NONE;
}